

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlDtdPtr xmlNewDtd(xmlDocPtr doc,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  xmlChar *pxVar1;
  xmlRegisterNodeFunc *pp_Var2;
  xmlDtdPtr cur;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if ((doc == (xmlDocPtr)0x0) || (doc->extSubset == (_xmlDtd *)0x0)) {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x80);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlTreeErrMemory("building DTD");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x80);
      doc_local->type = XML_DTD_NODE;
      if (name != (xmlChar *)0x0) {
        pxVar1 = xmlStrdup(name);
        doc_local->name = (char *)pxVar1;
      }
      if (ExternalID != (xmlChar *)0x0) {
        pxVar1 = xmlStrdup(ExternalID);
        doc_local->version = pxVar1;
      }
      if (SystemID != (xmlChar *)0x0) {
        pxVar1 = xmlStrdup(SystemID);
        doc_local->encoding = pxVar1;
      }
      if (doc != (xmlDocPtr)0x0) {
        doc->extSubset = (_xmlDtd *)doc_local;
      }
      doc_local->doc = doc;
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var2 = __xmlRegisterNodeDefaultValue(), *pp_Var2 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var2 = __xmlRegisterNodeDefaultValue();
        (**pp_Var2)((xmlNodePtr)doc_local);
      }
    }
  }
  else {
    doc_local = (xmlDocPtr)0x0;
  }
  return (xmlDtdPtr)doc_local;
}

Assistant:

xmlDtdPtr
xmlNewDtd(xmlDocPtr doc, const xmlChar *name,
                    const xmlChar *ExternalID, const xmlChar *SystemID) {
    xmlDtdPtr cur;

    if ((doc != NULL) && (doc->extSubset != NULL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewDtd(%s): document %s already have a DTD %s\n",
	    /* !!! */ (char *) name, doc->name,
	    /* !!! */ (char *)doc->extSubset->name);
#endif
	return(NULL);
    }

    /*
     * Allocate a new DTD and fill the fields.
     */
    cur = (xmlDtdPtr) xmlMalloc(sizeof(xmlDtd));
    if (cur == NULL) {
	xmlTreeErrMemory("building DTD");
	return(NULL);
    }
    memset(cur, 0 , sizeof(xmlDtd));
    cur->type = XML_DTD_NODE;

    if (name != NULL)
	cur->name = xmlStrdup(name);
    if (ExternalID != NULL)
	cur->ExternalID = xmlStrdup(ExternalID);
    if (SystemID != NULL)
	cur->SystemID = xmlStrdup(SystemID);
    if (doc != NULL)
	doc->extSubset = cur;
    cur->doc = doc;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}